

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

bool __thiscall Rml::Context::Update(Context *this)

{
  undefined1 *puVar1;
  NodePtr pDVar2;
  ulong uVar3;
  ulong *puVar4;
  bool bVar5;
  int iVar6;
  ulong uVar8;
  Element *this_00;
  ElementDocument *this_01;
  int index;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>_>
  *data_model;
  uint8_t *puVar9;
  ulong *puVar10;
  double dVar11;
  Vector2f vp_dimensions;
  iterator iVar12;
  NodePtr pDVar7;
  
  this->next_update_timeout = INFINITY;
  bVar5 = ScrollController::Update
                    ((this->scroll_controller)._M_t.
                     super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
                     .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl,
                     this->mouse_position,this->density_independent_pixel_ratio);
  if (bVar5) {
    dVar11 = this->next_update_timeout;
    if (0.0 <= dVar11) {
      dVar11 = 0.0;
    }
    this->next_update_timeout = dVar11;
  }
  if (this->mouse_active == true) {
    UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
  }
  iVar12 = robin_hood::detail::
           Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->data_models);
  pDVar7 = iVar12.mKeyVals;
  pDVar2 = (NodePtr)(this->data_models).mInfo;
  while (pDVar7 != pDVar2) {
    puVar9 = iVar12.mInfo;
    DataModel::Update(((iVar12.mKeyVals)->mData).second._M_t.
                      super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>
                      .super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl,true);
    pDVar7 = iVar12.mKeyVals + 1;
    uVar8 = *(ulong *)(puVar9 + 1);
    if (uVar8 == 0) {
      puVar4 = (ulong *)(puVar9 + 9);
      do {
        puVar10 = puVar4;
        pDVar7 = pDVar7 + 8;
        uVar8 = *puVar10;
        puVar4 = puVar10 + 1;
      } while (uVar8 == 0);
    }
    else {
      puVar10 = (ulong *)(puVar9 + 1);
    }
    uVar3 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar8 = uVar3 >> 3 & 0x1fffffff;
    pDVar7 = pDVar7 + uVar8;
    iVar12.mInfo = (uint8_t *)((long)puVar10 + uVar8);
    iVar12.mKeyVals = pDVar7;
  }
  puVar1 = &((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
  *puVar1 = *puVar1 & 0xfd;
  puVar1 = &((this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
  *puVar1 = *puVar1 & 0xfb;
  vp_dimensions.x = (float)(this->dimensions).x;
  vp_dimensions.y = (float)(this->dimensions).y;
  Element::Update((this->root)._M_t.
                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                  this->density_independent_pixel_ratio,vp_dimensions);
  index = 0;
  iVar6 = Element::GetNumChildren
                    ((this->root)._M_t.
                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                     super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
  if (0 < iVar6) {
    do {
      this_00 = Element::GetChild((this->root)._M_t.
                                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                  .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,index);
      this_01 = Element::GetOwnerDocument(this_00);
      if (this_01 != (ElementDocument *)0x0) {
        ElementDocument::UpdateLayout(this_01);
        ElementDocument::UpdatePosition(this_01);
      }
      index = index + 1;
      iVar6 = Element::GetNumChildren
                        ((this->root)._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    } while (index < iVar6);
  }
  ReleaseUnloadedDocuments(this);
  return true;
}

Assistant:

bool Context::Update()
{
	RMLUI_ZoneScoped;

	next_update_timeout = std::numeric_limits<double>::infinity();

	if (scroll_controller->Update(mouse_position, density_independent_pixel_ratio))
		RequestNextUpdate(0);

	// Update the hover chain to detect any new or moved elements under the mouse.
	if (mouse_active)
		UpdateHoverChain(mouse_position);

	// Update all the data models before updating properties and layout.
	for (auto& data_model : data_models)
		data_model.second->Update(true);

	// The style definition of each document should be independent of each other. By manually resetting these flags we avoid unnecessary definition
	// lookups in unrelated documents, such as when adding a new document. Adding an element dirties the parent definition, which in this case is the
	// root. By extension the definition of all the other documents are also dirtied, unnecessarily.
	root->dirty_definition = false;
	root->dirty_child_definitions = false;

	root->Update(density_independent_pixel_ratio, Vector2f(dimensions));

	for (int i = 0; i < root->GetNumChildren(); ++i)
	{
		if (auto doc = root->GetChild(i)->GetOwnerDocument())
		{
			doc->UpdateLayout();
			doc->UpdatePosition();
		}
	}

	// Release any documents that were unloaded during the update.
	ReleaseUnloadedDocuments();

	return true;
}